

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

void nni_aio_fini(nni_aio *aio)

{
  nni_aio_expire_q *mtx;
  nni_aio_cancel_fn p_Var1;
  void *pvVar2;
  nni_aio_expire_q *eq;
  void *arg;
  nni_aio_cancel_fn fn;
  nni_aio *aio_local;
  
  if ((aio != (nni_aio *)0x0) && ((aio->a_init & 1U) != 0)) {
    mtx = aio->a_expire_q;
    nni_mtx_lock(&mtx->eq_mtx);
    aio->a_stop = true;
    while ((aio->a_expiring & 1U) != 0) {
      nni_cv_wait(&mtx->eq_cv);
    }
    nni_aio_expire_rm(aio);
    p_Var1 = aio->a_cancel_fn;
    pvVar2 = aio->a_cancel_arg;
    aio->a_cancel_fn = (nni_aio_cancel_fn)0x0;
    aio->a_cancel_arg = (void *)0x0;
    nni_mtx_unlock(&mtx->eq_mtx);
    if (p_Var1 != (nni_aio_cancel_fn)0x0) {
      (*p_Var1)(aio,pvVar2,999);
    }
    nni_task_fini(&aio->a_task);
  }
  return;
}

Assistant:

void
nni_aio_fini(nni_aio *aio)
{
	if (aio != NULL && aio->a_init) {
		nni_aio_cancel_fn fn;
		void             *arg;
		nni_aio_expire_q *eq = aio->a_expire_q;

		// This is like aio_close, but we don't want to dispatch
		// the task.  And unlike aio_stop, we don't want to wait
		// for the task.  (Because we implicitly do task_fini.)
		// We also wait if the aio is being expired.
		nni_mtx_lock(&eq->eq_mtx);
		aio->a_stop = true;
		while (aio->a_expiring) {
			nni_cv_wait(&eq->eq_cv);
		}
		nni_aio_expire_rm(aio);
		fn                = aio->a_cancel_fn;
		arg               = aio->a_cancel_arg;
		aio->a_cancel_fn  = NULL;
		aio->a_cancel_arg = NULL;
		nni_mtx_unlock(&eq->eq_mtx);

		if (fn != NULL) {
			fn(aio, arg, NNG_ESTOPPED);
		}

		nni_task_fini(&aio->a_task);
	}
}